

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O2

void __thiscall
TPZReducedSpace::ShapeX(TPZReducedSpace *this,TPZVec<double> *qsi,TPZMaterialDataT<double> *data)

{
  TPZFNMatrix<20,_double> *this_00;
  TPZFNMatrix<60,_double> *this_01;
  double dVar1;
  TPZInterpolationSpace *this_02;
  int iVar2;
  double *pdVar3;
  int iVar4;
  ulong row;
  ulong uVar5;
  long lVar6;
  int istate;
  ulong newRows;
  ulong uVar7;
  int id;
  ulong uVar8;
  ulong row_00;
  TPZMaterialDataT<double> inteldata;
  TPZMaterialDataT<double> local_8260;
  
  this_02 = this->fReferred;
  TPZMaterialDataT<double>::TPZMaterialDataT(&local_8260);
  local_8260.super_TPZMaterialData.fNeedsSol = true;
  TPZInterpolationSpace::ComputeSolution(this_02,qsi,&local_8260,false);
  TPZManVector<TPZManVector<double,_10>,_20>::operator=(&data->sol,&local_8260.sol);
  TPZManVector<TPZFNMatrix<30,_double>,_20>::operator=(&data->dsol,&local_8260.dsol);
  TPZMaterialDataT<double>::~TPZMaterialDataT(&local_8260);
  newRows = (data->sol).super_TPZVec<TPZManVector<double,_10>_>.fNElements;
  uVar8 = (((data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore)->super_TPZVec<double>).
          fNElements;
  uVar7 = (data->super_TPZMaterialData).axes.super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.fRow;
  this_00 = &(data->super_TPZMaterialData).phi;
  iVar2 = (int)uVar8;
  TPZFMatrix<double>::Resize(&this_00->super_TPZFMatrix<double>,newRows,(long)iVar2);
  this_01 = &(data->super_TPZMaterialData).dphix;
  iVar4 = (int)uVar7;
  TPZFMatrix<double>::Resize(&this_01->super_TPZFMatrix<double>,(long)(iVar2 * iVar4),newRows);
  row = 0;
  uVar5 = 0;
  if (0 < iVar4) {
    uVar5 = uVar7 & 0xffffffff;
  }
  uVar8 = uVar8 & 0xffffffff;
  if (iVar2 < 1) {
    uVar8 = row;
  }
  if ((long)newRows < 1) {
    newRows = row;
  }
  for (; row != newRows; row = row + 1) {
    lVar6 = 0;
    for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
      dVar1 = (data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore[row].super_TPZVec<double>.
              fStore[uVar7];
      pdVar3 = TPZFMatrix<double>::operator()(&this_00->super_TPZFMatrix<double>,row,uVar7);
      *pdVar3 = dVar1;
      for (row_00 = 0; uVar5 != row_00; row_00 = row_00 + 1) {
        pdVar3 = TPZFMatrix<double>::operator()
                           (&(data->dsol).super_TPZVec<TPZFNMatrix<30,_double>_>.fStore[row].
                             super_TPZFMatrix<double>,row_00,uVar7);
        dVar1 = *pdVar3;
        pdVar3 = TPZFMatrix<double>::operator()
                           (&this_01->super_TPZFMatrix<double>,row_00 + lVar6,row);
        *pdVar3 = dVar1;
      }
      lVar6 = lVar6 + iVar4;
    }
  }
  return;
}

Assistant:

void TPZReducedSpace::ShapeX(TPZVec<REAL> &qsi,TPZMaterialDataT<STATE> &data)
{
    TPZInterpolationSpace *intel = ReferredIntel();

    {
        TPZMaterialDataT<STATE> inteldata;
        inteldata.fNeedsSol=true;
        constexpr bool hasPhi{false};
        intel->ComputeSolution(qsi,inteldata,hasPhi);
        data.sol = std::move(inteldata.sol);
        data.dsol = std::move(inteldata.dsol);
    }
    int64_t nsol = data.sol.size();
    int nstate = data.sol[0].size();
    int dim = data.axes.Rows();
    data.phi.Resize(nsol,nstate);
    data.dphix.Resize(nstate*dim,nsol);
    for (int64_t isol =0; isol<nsol; isol++) {
        for (int istate=0; istate<nstate; istate++) {
            data.phi(isol,istate) = data.sol[isol][istate];
            for (int id=0; id<dim; id++) {
                data.dphix(id+istate*dim,isol) = data.dsol[isol](id,istate);
            }
        }
    }
}